

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyGlobals.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_163::GlobalSetRemover::~GlobalSetRemover(GlobalSetRemover *this)

{
  GlobalSetRemover *this_local;
  
  ~GlobalSetRemover(this);
  operator_delete(this,0x140);
  return;
}

Assistant:

GlobalSetRemover(const NameSet* toRemove, bool optimize)
    : toRemove(toRemove), optimize(optimize) {}